

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
mul_by_limb(uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,limb_type v)

{
  uint uVar1;
  pointer pvVar2;
  uint *r;
  long lVar3;
  
  if (v != 1) {
    if (v == 0) {
      pvVar2 = (this->values).
               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
               elems;
      uVar1 = (this->values).
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elem_count;
      for (lVar3 = 0; (ulong)uVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
        *(undefined4 *)((long)pvVar2 + lVar3) = 0;
      }
    }
    else {
      r = (this->values).
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems;
      uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
      eval_multiply_1d<unsigned_int*,unsigned_int_const*>(r,r,v,0x40);
    }
  }
  return this;
}

Assistant:

constexpr auto mul_by_limb(const limb_type v) -> uintwide_t&
    {
      if(v == static_cast<limb_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0)));
      }
      else if(v > static_cast<limb_type>(UINT8_C(1)))
      {
        static_cast<void>(eval_multiply_1d(values.begin(),
                                           values.cbegin(),
                                           v,
                                           number_of_limbs));
      }

      return *this;
    }